

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O2

optional<uint256> *
node::ReadSnapshotBaseBlockhash(optional<uint256> *__return_storage_ptr__,path chaindir)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  bool bVar2;
  FILE *file;
  int64_t iVar3;
  int64_t iVar4;
  path *in_RSI;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  AutoFile afile;
  uint256 base_blockhash;
  string read_from_str;
  path local_80;
  path read_from;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::exists(in_RSI);
  if (bVar2) {
    std::filesystem::__cxx11::path::path(&local_80,in_RSI);
    fs::operator/(&read_from,(path *)&local_80,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
    std::filesystem::__cxx11::path::~path(&local_80);
    std::filesystem::__cxx11::path::string(&read_from_str,&read_from.super_path);
    bVar2 = std::filesystem::exists(&read_from.super_path);
    if (bVar2) {
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      base_blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      file = fsbridge::fopen((char *)&read_from,"rb");
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      AutoFile::AutoFile(&afile,(FILE *)file,data_xor);
      std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffee8);
      if (afile.m_file == (FILE *)0x0) {
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
        ;
        source_file_02._M_len = 0x66;
        logging_function_02._M_str = "ReadSnapshotBaseBlockhash";
        logging_function_02._M_len = 0x19;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_02,source_file_02,0x47,ALL,Info,
                   (ConstevalFormatString<1U>)0xcb6d26,&read_from_str);
        bVar2 = false;
      }
      else {
        base_blob<256U>::Unserialize<AutoFile>(&base_blockhash.super_base_blob<256U>,&afile);
        iVar3 = AutoFile::tell(&afile);
        AutoFile::seek(&afile,0,2);
        iVar4 = AutoFile::tell(&afile);
        if (iVar3 != iVar4) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
          ;
          source_file._M_len = 0x66;
          logging_function._M_str = "ReadSnapshotBaseBlockhash";
          logging_function._M_len = 0x19;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0x4f,ALL,Info,(ConstevalFormatString<1U>)0xcb6d65,
                     &read_from_str);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x10) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x18) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
          super__Optional_payload_base<uint256>._M_payload =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 8) =
             base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_;
        bVar2 = true;
      }
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = bVar2;
      AutoFile::~AutoFile(&afile);
    }
    else {
      std::filesystem::__cxx11::path::string((string *)&afile,in_RSI);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
      ;
      source_file_01._M_len = 0x66;
      logging_function_01._M_str = "ReadSnapshotBaseBlockhash";
      logging_function_01._M_len = 0x19;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_01,source_file_01,0x3e,ALL,Info,
                 (ConstevalFormatString<2U>)0xcb6c9a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&afile,
                 &read_from_str);
      std::__cxx11::string::~string((string *)&afile);
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = false;
    }
    std::__cxx11::string::~string((string *)&read_from_str);
    std::filesystem::__cxx11::path::~path(&read_from.super_path);
  }
  else {
    std::filesystem::__cxx11::path::string((string *)&afile,in_RSI);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file_00._M_len = 0x66;
    logging_function_00._M_str = "ReadSnapshotBaseBlockhash";
    logging_function_00._M_len = 0x19;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x35,ALL,Info,(ConstevalFormatString<1U>)0xcb6c4e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&afile);
    std::__cxx11::string::~string((string *)&afile);
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ReadSnapshotBaseBlockhash(fs::path chaindir)
{
    if (!fs::exists(chaindir)) {
        LogPrintf("[snapshot] cannot read base blockhash: no chainstate dir "
            "exists at path %s\n", fs::PathToString(chaindir));
        return std::nullopt;
    }
    const fs::path read_from = chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;
    const std::string read_from_str = fs::PathToString(read_from);

    if (!fs::exists(read_from)) {
        LogPrintf("[snapshot] snapshot chainstate dir is malformed! no base blockhash file "
            "exists at path %s. Try deleting %s and calling loadtxoutset again?\n",
            fs::PathToString(chaindir), read_from_str);
        return std::nullopt;
    }

    uint256 base_blockhash;
    FILE* file{fsbridge::fopen(read_from, "rb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for reading: %s\n",
            read_from_str);
        return std::nullopt;
    }
    afile >> base_blockhash;

    int64_t position = afile.tell();
    afile.seek(0, SEEK_END);
    if (position != afile.tell()) {
        LogPrintf("[snapshot] warning: unexpected trailing data in %s\n", read_from_str);
    }
    return base_blockhash;
}